

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O2

void __thiscall MODEL3D::three_dim_model::tidy_path(three_dim_model *this,Path *input_path)

{
  pointer pIVar1;
  iterator iVar2;
  __normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
  path_it;
  pointer pIVar3;
  pointer pIVar4;
  const_iterator __position;
  double dVar5;
  double dVar6;
  double dVar7;
  
  pIVar1 = (input_path->
           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pIVar4 = (input_path->
           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  dVar5 = 0.0;
  __position._M_current = pIVar1 + 1;
  for (pIVar3 = __position._M_current; pIVar3 != pIVar4; pIVar3 = pIVar3 + 1) {
    dVar6 = (double)(pIVar3->X - pIVar3[-1].X);
    dVar7 = (double)(pIVar3->Y - pIVar3[-1].Y);
    dVar5 = dVar5 + SQRT(dVar7 * dVar7 + dVar6 * dVar6);
  }
  dVar7 = (double)(pIVar4[-1].X - pIVar1->X);
  dVar6 = (double)(pIVar4[-1].Y - pIVar1->Y);
  dVar6 = ceil((dVar5 + SQRT(dVar6 * dVar6 + dVar7 * dVar7)) * 0.031415926535897934);
  dVar5 = (double)this->min_distance_between_points;
  if (dVar6 <= (double)this->min_distance_between_points) {
    dVar5 = dVar6;
  }
  for (; __position._M_current != pIVar4; __position._M_current = __position._M_current + 1) {
    dVar6 = (double)((__position._M_current)->X - __position._M_current[-1].X);
    dVar7 = (double)((__position._M_current)->Y - __position._M_current[-1].Y);
    if (SQRT(dVar7 * dVar7 + dVar6 * dVar6) < dVar5) {
      iVar2 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::erase
                        (input_path,__position);
      __position._M_current = iVar2._M_current + -1;
      pIVar4 = (input_path->
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    }
  }
  return;
}

Assistant:

void MODEL3D::three_dim_model::tidy_path(ClipperLib::Path &input_path)
{
    //determine perimeter of path
    double path_perimeter = 0;
    auto perim_start = std::next(input_path.begin(),1);
    auto path_end = input_path.end();
    for (auto path_it = perim_start; path_it != path_end; path_it++)
    {
        ClipperLib::IntPoint prev_pt = *std::prev(path_it);
        ClipperLib::IntPoint curr_pt = *path_it;
        double delta_x_sqr = std::pow((curr_pt.X - prev_pt.X), 2);
        double delta_y_sqr = std::pow((curr_pt.Y - prev_pt.Y), 2);
        double dist = std::sqrt(delta_x_sqr+delta_y_sqr);
        path_perimeter = path_perimeter + dist;
    }
    // last to first
    double delta_x_sqr = std::pow((std::prev(input_path.end(),1)->X - input_path.begin()->X), 2);
    double delta_y_sqr = std::pow((std::prev(input_path.end(),1)->Y - input_path.begin()->Y), 2);
    double dist = std::sqrt(delta_x_sqr+delta_y_sqr);
    path_perimeter = path_perimeter + dist;
    double tolerance = std::ceil(0.01*PI*path_perimeter);//1% of perimeter tolerance
    if(tolerance>min_distance_between_points)
        tolerance = min_distance_between_points;
    //remove bunched points
    for (auto path_it = perim_start; path_it != path_end; path_it++)
    {
        ClipperLib::IntPoint prev_pt = *std::prev(path_it);
        ClipperLib::IntPoint curr_pt = *path_it;
        double delta_x_sqr = std::pow((curr_pt.X - prev_pt.X), 2);
        double delta_y_sqr = std::pow((curr_pt.Y - prev_pt.Y), 2);
        double dist = std::sqrt(delta_x_sqr+delta_y_sqr);
        if(dist<tolerance)
        {
            //delete value, then move one back because loop steps you forward again
            path_it = std::prev(input_path.erase(path_it),1);
            path_end = input_path.end();
        }
    }
}